

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

int P_Thing_CheckProximity
              (AActor *self,PClass *classname,double distance,int count,int flags,int ptr,
              bool counting)

{
  uint uVar1;
  double dVar2;
  AActor *pAVar3;
  bool bVar4;
  int iVar5;
  AActor *this;
  AActor *other;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  TThinkerIterator<AActor> it;
  uint local_80;
  AActor *local_78;
  double local_60;
  double local_58;
  FThinkerIterator local_48;
  PClass *pPVar6;
  
  this = COPY_AAPTR(self,ptr);
  uVar7 = 0;
  if (((0.0 < distance) && (classname != (PClass *)0x0)) && (this != (AActor *)0x0)) {
    FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
    uVar8 = 0;
    other = (AActor *)FThinkerIterator::Next(&local_48,false);
    local_80 = 0;
    if (other != (AActor *)0x0) {
      uVar7 = (uint)((flags & 0x22U) == 0);
      local_60 = 0.0;
      local_78 = (AActor *)0x0;
      uVar8 = 0;
      local_80 = 0;
      local_58 = distance;
      do {
        if ((other != this) && (((other->flags).Value & 0x10000000) == 0)) {
          pPVar6 = (other->super_DThinker).super_DObject.Class;
          if ((flags & 1U) == 0) {
            if (pPVar6 == (PClass *)0x0) {
              iVar5 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
              pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
              (other->super_DThinker).super_DObject.Class = pPVar6;
            }
            if (pPVar6 == classname) {
LAB_0045be9e:
              dVar9 = AActor::Distance2D(this,other,false);
              if (dVar9 < distance) {
                if ((flags & 4U) == 0) {
                  dVar9 = (this->__Pos).Z;
                  dVar2 = (other->__Pos).Z;
                  if (((dVar9 <= dVar2) || (distance <= dVar9 - (other->Height + dVar2))) &&
                     ((dVar2 < dVar9 || (distance <= dVar2 - (dVar9 + this->Height)))))
                  goto LAB_0045bfa3;
                }
                if ((((uint)flags >> 0xc & 1) == 0) || (bVar4 = P_CheckSight(other,this,9), bVar4))
                {
                  pAVar3 = local_78;
                  dVar9 = local_60;
                  dVar2 = local_58;
                  if (((flags & 0x1c0U) != 0) &&
                     ((((dVar10 = AActor::Distance2D(this,other,false), pAVar3 = other,
                        ((uint)flags >> 10 & 1) == 0 || (dVar2 = dVar10, local_58 <= dVar10)) &&
                       ((((uint)flags >> 9 & 1) == 0 ||
                        (dVar9 = dVar10, dVar2 = local_58, dVar10 <= local_60)))) &&
                      (pAVar3 = local_78, dVar9 = local_60, dVar2 = local_58,
                      local_78 == (AActor *)0x0)))) {
                    pAVar3 = other;
                  }
                  local_58 = dVar2;
                  local_60 = dVar9;
                  local_78 = pAVar3;
                  if (((other->flags6).Value & 0x40000) == 0) {
                    if ((flags & 0x10U) == 0) {
LAB_0045bfc5:
                      uVar1 = uVar8 + 1;
                      bVar4 = count <= (int)uVar8;
                      uVar8 = uVar1;
                      if ((bVar4 && !counting) &&
                         (local_80 = uVar7, (flags & 0x600U) == 0 || (flags & 0x1c0U) == 0)) break;
                    }
                  }
                  else if ((flags & 0x18U) != 0) goto LAB_0045bfc5;
                }
              }
            }
          }
          else {
            if (pPVar6 == (PClass *)0x0) {
              iVar5 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
              pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar5);
              (other->super_DThinker).super_DObject.Class = pPVar6;
            }
            bVar4 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != classname && bVar4) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar4 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == classname) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (bVar4) goto LAB_0045be9e;
          }
        }
LAB_0045bfa3:
        other = (AActor *)FThinkerIterator::Next(&local_48,false);
      } while (other != (AActor *)0x0);
      if (((flags & 0x1c0U) != 0) && (local_78 != (AActor *)0x0)) {
        if (((uint)flags >> 0xb & 1) == 0) {
          this = self;
        }
        if ((flags & 0x40U) != 0) {
          (this->target).field_0.p = local_78;
        }
        if ((char)flags < '\0') {
          (this->master).field_0.p = local_78;
        }
        if (((uint)flags >> 8 & 1) != 0) {
          (this->tracer).field_0.p = local_78;
        }
      }
    }
    uVar7 = uVar8;
    if (((!counting) && (uVar7 = 1, uVar8 != count)) && (uVar7 = local_80, (int)uVar8 < count)) {
      uVar7 = (uint)((flags & 0x22U) == 2);
    }
  }
  return uVar7;
}

Assistant:

int P_Thing_CheckProximity(AActor *self, PClass *classname, double distance, int count, int flags, int ptr, bool counting)
{
	AActor *ref = COPY_AAPTR(self, ptr);

	// We need these to check out.
	if (!ref || !classname || distance <= 0)
		return 0;
	
	int counter = 0;
	int result = 0;
	double closer = distance, farther = 0, current = distance;
	const bool ptrWillChange = !!(flags & (CPXF_SETTARGET | CPXF_SETMASTER | CPXF_SETTRACER));
	const bool ptrDistPref = !!(flags & (CPXF_CLOSEST | CPXF_FARTHEST));

	TThinkerIterator<AActor> it;
	AActor *mo, *dist = nullptr;

	// [MC] Process of elimination, I think, will get through this as quickly and 
	// efficiently as possible. 
	while ((mo = it.Next()))
	{
		if (mo == ref) //Don't count self.
			continue;

		// no unmorphed versions of currently morphed players.
		if (mo->flags & MF_UNMORPHED)
			continue;

		// Check inheritance for the classname. Taken partly from CheckClass DECORATE function.
		if (flags & CPXF_ANCESTOR)
		{
			if (!(mo->IsKindOf(classname)))
				continue;
		}
		// Otherwise, just check for the regular class name.
		else if (classname != mo->GetClass())
			continue;

		// [MC]Make sure it's in range and respect the desire for Z or not. The function forces it to use
		// Z later for ensuring CLOSEST and FARTHEST flags are respected perfectly.
		// Ripped from sphere checking in A_RadiusGive (along with a number of things).
		if ((ref->Distance2D(mo) < distance &&
			((flags & CPXF_NOZ) ||
			((ref->Z() > mo->Z() && ref->Z() - mo->Top() < distance) ||
			(ref->Z() <= mo->Z() && mo->Z() - ref->Top() < distance)))))
		{
			if ((flags & CPXF_CHECKSIGHT) && !(P_CheckSight(mo, ref, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY)))
				continue;

			if (ptrWillChange)
			{
				current = ref->Distance2D(mo);

				if ((flags & CPXF_CLOSEST) && (current < closer))
				{
					dist = mo;
					closer = current; // This actor's closer. Set the new standard.
				}
				else if ((flags & CPXF_FARTHEST) && (current > farther))
				{
					dist = mo;
					farther = current;
				}
				else if (!dist)
					dist = mo; // Just get the first one and call it quits if there's nothing selected.
			}
			if (mo->flags6 & MF6_KILLED)
			{
				if (!(flags & (CPXF_COUNTDEAD | CPXF_DEADONLY)))
					continue;
			}
			else
			{
				if (flags & CPXF_DEADONLY)
					continue;
			}
			counter++;

			// Abort if the number of matching classes nearby is greater, we have obviously succeeded in our goal.
			// Don't abort if calling the counting version CheckProximity non-action function.
			if (!counting && counter > count)
			{					
				result = (flags & (CPXF_LESSOREQUAL | CPXF_EXACT)) ? 0 : 1;

				// However, if we have one SET* flag and either the closest or farthest flags, keep the function going.
				if (ptrWillChange && ptrDistPref)
					continue;
				else
					break;
			}
		}
	}

	if (ptrWillChange && dist != 0)
	{
		if (flags & CPXF_SETONPTR)
		{
			if (flags & CPXF_SETTARGET)		ref->target = dist;
			if (flags & CPXF_SETMASTER)		ref->master = dist;
			if (flags & CPXF_SETTRACER)		ref->tracer = dist;
		}
		else
		{
			if (flags & CPXF_SETTARGET)		self->target = dist;
			if (flags & CPXF_SETMASTER)		self->master = dist;
			if (flags & CPXF_SETTRACER)		self->tracer = dist;
		}
	}

	if (!counting)
	{
		if (counter == count)
			result = 1;
		else if (counter < count)
			result = !!((flags & CPXF_LESSOREQUAL) && !(flags & CPXF_EXACT)) ? 1 : 0;
	}
	return counting ? counter : result;
}